

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_stbvorbis_seek_to_pcm_frame(ma_stbvorbis *pVorbis,ma_uint64 frameIndex)

{
  ma_uint8 *pmVar1;
  _func_void_void_ptr_void_ptr *p_Var2;
  ulong uVar3;
  ma_result mVar4;
  int iVar5;
  ulong frameCount;
  ma_uint64 framesRead;
  float buffer [4096];
  ma_uint64 local_4030;
  undefined1 local_4028 [16392];
  
  mVar4 = MA_INVALID_ARGS;
  if (pVorbis != (ma_stbvorbis *)0x0) {
    if (pVorbis->usingPushMode == 0) {
      mVar4 = MA_INVALID_ARGS;
      if (frameIndex >> 0x20 == 0) {
        iVar5 = stb_vorbis_seek(pVorbis->stb,(uint)frameIndex);
        if (iVar5 == 0) {
          mVar4 = MA_ERROR;
        }
        else {
          pVorbis->cursor = frameIndex;
LAB_0016e78c:
          mVar4 = MA_SUCCESS;
        }
      }
    }
    else {
      if (frameIndex < pVorbis->cursor) {
        if (0x7fffffff < frameIndex) {
          return MA_INVALID_ARGS;
        }
        stb_vorbis_close(pVorbis->stb);
        pmVar1 = (pVorbis->push).pData;
        if ((pmVar1 != (ma_uint8 *)0x0) &&
           (p_Var2 = (pVorbis->allocationCallbacks).onFree,
           p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
          (*p_Var2)(pmVar1,(pVorbis->allocationCallbacks).pUserData);
        }
        (pVorbis->push).framesConsumed = 0;
        (pVorbis->push).framesRemaining = 0;
        (pVorbis->push).ppPacketData = (float **)0x0;
        (pVorbis->push).dataCapacity = 0;
        (pVorbis->push).audioStartOffsetInBytes = 0;
        (pVorbis->push).pData = (ma_uint8 *)0x0;
        (pVorbis->push).dataSize = 0;
        mVar4 = (*pVorbis->onSeek)(pVorbis->pReadSeekTellUserData,0,ma_seek_origin_start);
        if (mVar4 != MA_SUCCESS) {
          return mVar4;
        }
        mVar4 = ma_stbvorbis_init_internal_decoder_push(pVorbis);
        if (mVar4 != MA_SUCCESS) {
          return mVar4;
        }
        pVorbis->cursor = 0;
      }
      do {
        frameCount = frameIndex - pVorbis->cursor;
        if (frameIndex < pVorbis->cursor || frameCount == 0) goto LAB_0016e78c;
        uVar3 = 0x1000 / (ulong)pVorbis->channels;
        if (uVar3 <= frameCount) {
          frameCount = uVar3;
        }
        mVar4 = ma_stbvorbis_read_pcm_frames(pVorbis,local_4028,frameCount,&local_4030);
      } while (mVar4 == MA_SUCCESS);
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_stbvorbis_seek_to_pcm_frame(ma_stbvorbis* pVorbis, ma_uint64 frameIndex)
{
    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        /* Different seeking methods depending on whether or not we're using push mode. */
        if (pVorbis->usingPushMode) {
            /* Push mode. This is the complex case. */
            ma_result result;
            float buffer[4096];

            /* If we're seeking backwards, we need to seek back to the start and then brute-force forward. */
            if (frameIndex < pVorbis->cursor) {
                if (frameIndex > 0x7FFFFFFF) {
                    return MA_INVALID_ARGS; /* Trying to seek beyond the 32-bit maximum of stb_vorbis. */
                }

                /*
                This is wildly inefficient due to me having trouble getting sample exact seeking working
                robustly with stb_vorbis_flush_pushdata(). The only way I can think to make this work
                perfectly is to reinitialize the decoder. Note that we only enter this path when seeking
                backwards. This will hopefully be removed once we get our own Vorbis decoder implemented.
                */
                stb_vorbis_close(pVorbis->stb);
                ma_free(pVorbis->push.pData, &pVorbis->allocationCallbacks);

                MA_ZERO_OBJECT(&pVorbis->push);

                /* Seek to the start of the file. */
                result = pVorbis->onSeek(pVorbis->pReadSeekTellUserData, 0, ma_seek_origin_start);
                if (result != MA_SUCCESS) {
                    return result;
                }

                result = ma_stbvorbis_init_internal_decoder_push(pVorbis);
                if (result != MA_SUCCESS) {
                    return result;
                }

                /* At this point we should be sitting on the first frame. */
                pVorbis->cursor = 0;
            }

            /* We're just brute-forcing this for now. */
            while (pVorbis->cursor < frameIndex) {
                ma_uint64 framesRead;
                ma_uint64 framesToRead = ma_countof(buffer)/pVorbis->channels;
                if (framesToRead > (frameIndex - pVorbis->cursor)) {
                    framesToRead = (frameIndex - pVorbis->cursor);
                }

                result = ma_stbvorbis_read_pcm_frames(pVorbis, buffer, framesToRead, &framesRead);
                if (result != MA_SUCCESS) {
                    return result;
                }
            }
        } else {
            /* Pull mode. This is the simple case. */
            int vorbisResult;

            if (frameIndex > UINT_MAX) {
                return MA_INVALID_ARGS; /* Trying to seek beyond the 32-bit maximum of stb_vorbis. */
            }

            vorbisResult = stb_vorbis_seek(pVorbis->stb, (unsigned int)frameIndex);  /* Safe cast. */
            if (vorbisResult == 0) {
                return MA_ERROR;    /* See failed. */
            }

            pVorbis->cursor = frameIndex;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)frameIndex;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}